

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRRLoader.h
# Opt level: O1

void __thiscall Assimp::IRRImporter::Node::Node(Node *this,ET t)

{
  size_t sVar1;
  char buffer [128];
  undefined1 *local_d8 [2];
  undefined1 local_c8 [16];
  char local_b8 [136];
  
  this->type = t;
  (this->position).x = 0.0;
  (this->position).y = 0.0;
  *(undefined8 *)&(this->position).z = 0;
  (this->rotation).y = 0.0;
  (this->rotation).z = 0.0;
  (this->scaling).x = 1.0;
  (this->scaling).y = 1.0;
  (this->scaling).z = 1.0;
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  (this->children).
  super__Vector_base<Assimp::IRRImporter::Node_*,_std::allocator<Assimp::IRRImporter::Node_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->children).
  super__Vector_base<Assimp::IRRImporter::Node_*,_std::allocator<Assimp::IRRImporter::Node_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->children).
  super__Vector_base<Assimp::IRRImporter::Node_*,_std::allocator<Assimp::IRRImporter::Node_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->parent = (Node *)0x0;
  this->framesPerSecond = 0.0;
  (this->meshPath)._M_dataplus._M_p = (pointer)&(this->meshPath).field_2;
  (this->meshPath)._M_string_length = 0;
  (this->meshPath).field_2._M_local_buf[0] = '\0';
  this->id = 0;
  (this->materials).
  super__Vector_base<std::pair<aiMaterial_*,_unsigned_int>,_std::allocator<std::pair<aiMaterial_*,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->materials).
  super__Vector_base<std::pair<aiMaterial_*,_unsigned_int>,_std::allocator<std::pair<aiMaterial_*,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->materials).
  super__Vector_base<std::pair<aiMaterial_*,_unsigned_int>,_std::allocator<std::pair<aiMaterial_*,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->sphereRadius = 1.0;
  this->spherePolyCountX = 100;
  this->spherePolyCountY = 100;
  (this->animators).
  super__List_base<Assimp::IRRImporter::Animator,_std::allocator<Assimp::IRRImporter::Animator>_>.
  _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->animators;
  (this->animators).
  super__List_base<Assimp::IRRImporter::Animator,_std::allocator<Assimp::IRRImporter::Animator>_>.
  _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->animators;
  (this->animators).
  super__List_base<Assimp::IRRImporter::Animator,_std::allocator<Assimp::IRRImporter::Animator>_>.
  _M_impl._M_node._M_size = 0;
  Node::cnt = Node::cnt + 1;
  snprintf(local_b8,0x80,"IrrNode_%i");
  local_d8[0] = local_c8;
  sVar1 = strlen(local_b8);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,local_b8,local_b8 + sVar1);
  std::__cxx11::string::operator=((string *)&this->name,(string *)local_d8);
  if (local_d8[0] != local_c8) {
    operator_delete(local_d8[0]);
  }
  std::
  vector<std::pair<aiMaterial_*,_unsigned_int>,_std::allocator<std::pair<aiMaterial_*,_unsigned_int>_>_>
  ::reserve(&this->materials,5);
  std::vector<Assimp::IRRImporter::Node_*,_std::allocator<Assimp::IRRImporter::Node_*>_>::reserve
            (&this->children,5);
  return;
}

Assistant:

explicit Node(ET t)
            :   type                (t)
            ,   scaling             (1.0,1.0,1.0) // assume uniform scaling by default
            ,   parent()
            ,   framesPerSecond     (0.0)
            ,   id()
            ,   sphereRadius        (1.0)
            ,   spherePolyCountX    (100)
            ,   spherePolyCountY    (100)
        {

            // Generate a default name for the node
            char buffer[128];
            static int cnt;
            ai_snprintf(buffer, 128, "IrrNode_%i",cnt++);
            name = std::string(buffer);

            // reserve space for up to 5 materials
            materials.reserve(5);

            // reserve space for up to 5 children
            children.reserve(5);
        }